

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.h
# Opt level: O3

longlong __thiscall
shift_window_transformer::PatchMerging<float>::parameterCount(PatchMerging<float> *this)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  longlong lVar2;
  
  pvVar1 = (this->layer).weights;
  lVar2 = (long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if ((this->layer).use_bias == true) {
    pvVar1 = (this->layer).bias;
    lVar2 = lVar2 + ((long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  }
  return lVar2;
}

Assistant:

long long parameterCount() {
            if (use_bias)
                return weights->size() + bias->size();
            return weights->size();
        }